

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_internal.c
# Opt level: O0

int mbedtls_rsa_deduce_private_exponent(mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *E,mbedtls_mpi *D)

{
  int iVar1;
  undefined1 local_68 [8];
  mbedtls_mpi L;
  mbedtls_mpi K;
  int ret;
  mbedtls_mpi *D_local;
  mbedtls_mpi *E_local;
  mbedtls_mpi *Q_local;
  mbedtls_mpi *P_local;
  
  if ((D == (mbedtls_mpi *)0x0) || (iVar1 = mbedtls_mpi_cmp_int(D,0), iVar1 != 0)) {
    P_local._4_4_ = -4;
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(P,1);
    if ((iVar1 < 1) ||
       ((iVar1 = mbedtls_mpi_cmp_int(Q,1), iVar1 < 1 ||
        (iVar1 = mbedtls_mpi_cmp_int(E,0), iVar1 == 0)))) {
      P_local._4_4_ = -4;
    }
    else {
      mbedtls_mpi_init((mbedtls_mpi *)&L.p);
      mbedtls_mpi_init((mbedtls_mpi *)local_68);
      K.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&L.p,P,1);
      if ((K.p._4_4_ == 0) &&
         ((((K.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)local_68,Q,1), K.p._4_4_ == 0 &&
            (K.p._4_4_ = mbedtls_mpi_gcd(D,(mbedtls_mpi *)&L.p,(mbedtls_mpi *)local_68),
            K.p._4_4_ == 0)) &&
           (K.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&L.p,(mbedtls_mpi *)&L.p,
                                            (mbedtls_mpi *)local_68), K.p._4_4_ == 0)) &&
          (K.p._4_4_ = mbedtls_mpi_div_mpi((mbedtls_mpi *)&L.p,(mbedtls_mpi *)0x0,
                                           (mbedtls_mpi *)&L.p,D), K.p._4_4_ == 0)))) {
        K.p._4_4_ = mbedtls_mpi_inv_mod(D,E,(mbedtls_mpi *)&L.p);
      }
      mbedtls_mpi_free((mbedtls_mpi *)&L.p);
      mbedtls_mpi_free((mbedtls_mpi *)local_68);
      P_local._4_4_ = K.p._4_4_;
    }
  }
  return P_local._4_4_;
}

Assistant:

int mbedtls_rsa_deduce_private_exponent( mbedtls_mpi const *P,
                                         mbedtls_mpi const *Q,
                                         mbedtls_mpi const *E,
                                         mbedtls_mpi *D )
{
    int ret = 0;
    mbedtls_mpi K, L;

    if( D == NULL || mbedtls_mpi_cmp_int( D, 0 ) != 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    if( mbedtls_mpi_cmp_int( P, 1 ) <= 0 ||
        mbedtls_mpi_cmp_int( Q, 1 ) <= 0 ||
        mbedtls_mpi_cmp_int( E, 0 ) == 0 )
    {
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );
    }

    mbedtls_mpi_init( &K );
    mbedtls_mpi_init( &L );

    /* Temporarily put K := P-1 and L := Q-1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &L, Q, 1 ) );

    /* Temporarily put D := gcd(P-1, Q-1) */
    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( D, &K, &L ) );

    /* K := LCM(P-1, Q-1) */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &K, &K, &L ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( &K, NULL, &K, D ) );

    /* Compute modular inverse of E in LCM(P-1, Q-1) */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( D, E, &K ) );

cleanup:

    mbedtls_mpi_free( &K );
    mbedtls_mpi_free( &L );

    return( ret );
}